

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtextdocument.cpp
# Opt level: O0

void QTextDocument::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  qreal *pqVar1;
  bool bVar2;
  int iVar3;
  QTextDocument *this;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  qreal qVar4;
  void *_v_1;
  void *_v;
  QTextDocument *_t;
  QVariant _r;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  QFont *in_stack_fffffffffffffea0;
  QFont *in_stack_fffffffffffffea8;
  bool b;
  QString *in_stack_fffffffffffffeb0;
  QUrl local_78 [4];
  QSizeF local_58;
  QSizeF local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_fffffffffffffeb0 = (QString *)(ulong)in_EDX;
    bVar2 = SUB41((uint)in_stack_fffffffffffffe9c >> 0x18,0);
    switch(in_stack_fffffffffffffeb0) {
    case (QString *)0x0:
      contentsChange((QTextDocument *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8,
                     (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      break;
    case (QString *)0x1:
      contentsChanged((QTextDocument *)0x7bb7fd);
      break;
    case (QString *)0x2:
      undoAvailable((QTextDocument *)0x7bb822,bVar2);
      break;
    case (QString *)0x3:
      redoAvailable((QTextDocument *)0x7bb847,bVar2);
      break;
    case (QString *)0x4:
      undoCommandAdded((QTextDocument *)0x7bb859);
      break;
    case (QString *)0x5:
      modificationChanged((QTextDocument *)0x7bb87e,bVar2);
      break;
    case (QString *)0x6:
      cursorPositionChanged
                ((QTextDocument *)in_stack_fffffffffffffea0,
                 (QTextCursor *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      break;
    case (QString *)0x7:
      blockCountChanged((QTextDocument *)0x7bb8bc,in_stack_fffffffffffffe9c);
      break;
    case (QString *)0x8:
      baseUrlChanged((QTextDocument *)in_stack_fffffffffffffea0,
                     (QUrl *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      break;
    case (QString *)0x9:
      documentLayoutChanged((QTextDocument *)0x7bb8ec);
      break;
    case (QString *)0xa:
      undo((QTextDocument *)in_stack_fffffffffffffea0);
      break;
    case (QString *)0xb:
      redo((QTextDocument *)in_stack_fffffffffffffea0);
      break;
    case (QString *)0xc:
      appendUndoItem((QTextDocument *)in_stack_fffffffffffffea0,
                     (QAbstractUndoItem *)
                     CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      break;
    case (QString *)0xd:
      setModified((QTextDocument *)in_stack_fffffffffffffea0,bVar2);
      break;
    case (QString *)0xe:
      setModified((QTextDocument *)in_stack_fffffffffffffea0,bVar2);
      break;
    case (QString *)0xf:
      local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*in_RDI + 0x70))(&local_28,in_RDI,**(undefined4 **)(in_RCX + 8));
      if (*(long *)in_RCX != 0) {
        ::QVariant::operator=
                  ((QVariant *)in_stack_fffffffffffffea8,(QVariant *)in_stack_fffffffffffffea0);
      }
      ::QVariant::~QVariant((QVariant *)&local_28);
    }
  }
  if ((in_ESI != 5) ||
     ((((((bVar2 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)(int,int,int)>
                             (in_RCX,(void **)contentsChange,0,0), !bVar2 &&
          (bVar2 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)()>
                             (in_RCX,(void **)contentsChanged,0,1), !bVar2)) &&
         (bVar2 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)(bool)>
                            (in_RCX,(void **)undoAvailable,0,2), !bVar2)) &&
        ((bVar2 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)(bool)>
                            (in_RCX,(void **)redoAvailable,0,3), !bVar2 &&
         (bVar2 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)()>
                            (in_RCX,(void **)undoCommandAdded,0,4), !bVar2)))) &&
       ((bVar2 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)(bool)>
                           (in_RCX,(void **)modificationChanged,0,5), !bVar2 &&
        ((bVar2 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)(QTextCursor_const&)>
                            (in_RCX,(void **)cursorPositionChanged,0,6), !bVar2 &&
         (bVar2 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)(int)>
                            (in_RCX,(void **)blockCountChanged,0,7), !bVar2)))))) &&
      ((bVar2 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)(QUrl_const&)>
                          (in_RCX,(void **)baseUrlChanged,0,8), !bVar2 &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)()>
                          (in_RCX,(void **)documentLayoutChanged,0,9), !bVar2)))))) {
    if (in_ESI == 1) {
      pqVar1 = *(qreal **)in_RCX;
      in_stack_fffffffffffffea8 = (QFont *)(ulong)in_EDX;
      switch(in_stack_fffffffffffffea8) {
      case (QFont *)0x0:
        bVar2 = isUndoRedoEnabled((QTextDocument *)in_stack_fffffffffffffea0);
        *(bool *)pqVar1 = bVar2;
        break;
      case (QFont *)0x1:
        bVar2 = isModified((QTextDocument *)in_stack_fffffffffffffea0);
        *(bool *)pqVar1 = bVar2;
        break;
      case (QFont *)0x2:
        local_48 = pageSize((QTextDocument *)in_stack_fffffffffffffea8);
        *pqVar1 = local_48.wd;
        pqVar1[1] = local_48.ht;
        break;
      case (QFont *)0x3:
        defaultFont((QTextDocument *)in_stack_fffffffffffffea8);
        QFont::operator=(in_stack_fffffffffffffea0,
                         (QFont *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        QFont::~QFont((QFont *)0x7bbdb2);
        break;
      case (QFont *)0x4:
        bVar2 = useDesignMetrics((QTextDocument *)in_stack_fffffffffffffea0);
        *(bool *)pqVar1 = bVar2;
        break;
      case (QFont *)0x5:
        bVar2 = isLayoutEnabled((QTextDocument *)in_stack_fffffffffffffea0);
        *(bool *)pqVar1 = bVar2;
        break;
      case (QFont *)0x6:
        local_58 = size((QTextDocument *)0x7bbe00);
        *pqVar1 = local_58.wd;
        pqVar1[1] = local_58.ht;
        break;
      case (QFont *)0x7:
        qVar4 = textWidth((QTextDocument *)in_stack_fffffffffffffea0);
        *pqVar1 = qVar4;
        break;
      case (QFont *)0x8:
        iVar3 = blockCount((QTextDocument *)in_stack_fffffffffffffea0);
        *(int *)pqVar1 = iVar3;
        break;
      case (QFont *)0x9:
        qVar4 = indentWidth((QTextDocument *)in_stack_fffffffffffffea0);
        *pqVar1 = qVar4;
        break;
      case (QFont *)0xa:
        defaultStyleSheet((QTextDocument *)in_stack_fffffffffffffea8);
        QString::operator=((QString *)in_stack_fffffffffffffea0,
                           (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
        ;
        QString::~QString((QString *)0x7bbeb8);
        break;
      case (QFont *)0xb:
        iVar3 = maximumBlockCount((QTextDocument *)in_stack_fffffffffffffea0);
        *(int *)pqVar1 = iVar3;
        break;
      case (QFont *)0xc:
        qVar4 = documentMargin((QTextDocument *)in_stack_fffffffffffffea0);
        *pqVar1 = qVar4;
        break;
      case (QFont *)0xd:
        baseUrl((QTextDocument *)in_stack_fffffffffffffea8);
        QUrl::operator=((QUrl *)in_stack_fffffffffffffea0,
                        (QUrl *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        QUrl::~QUrl(local_78);
      }
    }
    if (in_ESI == 2) {
      this = (QTextDocument *)(ulong)in_EDX;
      bVar2 = SUB41((uint)in_stack_fffffffffffffe9c >> 0x18,0);
      b = SUB81((ulong)in_stack_fffffffffffffea8 >> 0x38,0);
      switch(this) {
      case (QTextDocument *)0x0:
        setUndoRedoEnabled(this,bVar2);
        break;
      case (QTextDocument *)0x1:
        setModified(this,bVar2);
        break;
      case (QTextDocument *)0x2:
        setPageSize((QTextDocument *)in_stack_fffffffffffffeb0,(QSizeF *)in_stack_fffffffffffffea8);
        break;
      case (QTextDocument *)0x3:
        setDefaultFont((QTextDocument *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        break;
      case (QTextDocument *)0x4:
        setUseDesignMetrics((QTextDocument *)in_stack_fffffffffffffeb0,b);
        break;
      case (QTextDocument *)0x5:
        setLayoutEnabled((QTextDocument *)in_stack_fffffffffffffeb0,b);
        break;
      default:
        break;
      case (QTextDocument *)0x7:
        setTextWidth((QTextDocument *)in_stack_fffffffffffffeb0,(qreal)in_stack_fffffffffffffea8);
        break;
      case (QTextDocument *)0x9:
        setIndentWidth((QTextDocument *)in_stack_fffffffffffffeb0,(qreal)in_stack_fffffffffffffea8);
        break;
      case (QTextDocument *)0xa:
        setDefaultStyleSheet(*(QTextDocument **)in_RCX,in_stack_fffffffffffffeb0);
        break;
      case (QTextDocument *)0xb:
        setMaximumBlockCount
                  ((QTextDocument *)in_stack_fffffffffffffeb0,
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        break;
      case (QTextDocument *)0xc:
        setDocumentMargin(*(QTextDocument **)in_RCX,(qreal)in_stack_fffffffffffffeb0);
        break;
      case (QTextDocument *)0xd:
        setBaseUrl((QTextDocument *)in_stack_fffffffffffffeb0,(QUrl *)in_stack_fffffffffffffea8);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocument::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTextDocument *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->contentsChange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 1: _t->contentsChanged(); break;
        case 2: _t->undoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->redoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->undoCommandAdded(); break;
        case 5: _t->modificationChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 6: _t->cursorPositionChanged((*reinterpret_cast< std::add_pointer_t<QTextCursor>>(_a[1]))); break;
        case 7: _t->blockCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->baseUrlChanged((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 9: _t->documentLayoutChanged(); break;
        case 10: _t->undo(); break;
        case 11: _t->redo(); break;
        case 12: _t->appendUndoItem((*reinterpret_cast< std::add_pointer_t<QAbstractUndoItem*>>(_a[1]))); break;
        case 13: _t->setModified((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 14: _t->setModified(); break;
        case 15: { QVariant _r = _t->loadResource((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(int , int , int )>(_a, &QTextDocument::contentsChange, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)()>(_a, &QTextDocument::contentsChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(bool )>(_a, &QTextDocument::undoAvailable, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(bool )>(_a, &QTextDocument::redoAvailable, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)()>(_a, &QTextDocument::undoCommandAdded, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(bool )>(_a, &QTextDocument::modificationChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(const QTextCursor & )>(_a, &QTextDocument::cursorPositionChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(int )>(_a, &QTextDocument::blockCountChanged, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(const QUrl & )>(_a, &QTextDocument::baseUrlChanged, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)()>(_a, &QTextDocument::documentLayoutChanged, 9))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isUndoRedoEnabled(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isModified(); break;
        case 2: *reinterpret_cast<QSizeF*>(_v) = _t->pageSize(); break;
        case 3: *reinterpret_cast<QFont*>(_v) = _t->defaultFont(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->useDesignMetrics(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isLayoutEnabled(); break;
        case 6: *reinterpret_cast<QSizeF*>(_v) = _t->size(); break;
        case 7: *reinterpret_cast<qreal*>(_v) = _t->textWidth(); break;
        case 8: *reinterpret_cast<int*>(_v) = _t->blockCount(); break;
        case 9: *reinterpret_cast<qreal*>(_v) = _t->indentWidth(); break;
        case 10: *reinterpret_cast<QString*>(_v) = _t->defaultStyleSheet(); break;
        case 11: *reinterpret_cast<int*>(_v) = _t->maximumBlockCount(); break;
        case 12: *reinterpret_cast<qreal*>(_v) = _t->documentMargin(); break;
        case 13: *reinterpret_cast<QUrl*>(_v) = _t->baseUrl(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setUndoRedoEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setModified(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setPageSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 3: _t->setDefaultFont(*reinterpret_cast<QFont*>(_v)); break;
        case 4: _t->setUseDesignMetrics(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setLayoutEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setTextWidth(*reinterpret_cast<qreal*>(_v)); break;
        case 9: _t->setIndentWidth(*reinterpret_cast<qreal*>(_v)); break;
        case 10: _t->setDefaultStyleSheet(*reinterpret_cast<QString*>(_v)); break;
        case 11: _t->setMaximumBlockCount(*reinterpret_cast<int*>(_v)); break;
        case 12: _t->setDocumentMargin(*reinterpret_cast<qreal*>(_v)); break;
        case 13: _t->setBaseUrl(*reinterpret_cast<QUrl*>(_v)); break;
        default: break;
        }
    }
}